

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O1

void __thiscall
Fl_Text_Buffer::Fl_Text_Buffer(Fl_Text_Buffer *this,int requestedSize,int preferredGapSize)

{
  char *pcVar1;
  
  this->mLength = 0;
  this->mPreferredGapSize = preferredGapSize;
  pcVar1 = (char *)malloc((long)(requestedSize + preferredGapSize));
  this->mBuf = pcVar1;
  this->mGapStart = 0;
  this->mGapEnd = preferredGapSize;
  this->mTabDist = 8;
  (this->mPrimary).mStart = 0;
  (this->mPrimary).mEnd = 0;
  (this->mPrimary).mSelected = false;
  (this->mSecondary).mStart = 0;
  (this->mSecondary).mEnd = 0;
  (this->mSecondary).mSelected = false;
  (this->mHighlight).mStart = 0;
  (this->mHighlight).mEnd = 0;
  (this->mHighlight).mSelected = false;
  *(undefined8 *)&this->mNModifyProcs = 0;
  *(undefined8 *)((long)&this->mModifyProcs + 4) = 0;
  *(undefined8 *)((long)&this->mCbArgs + 4) = 0;
  this->mPredeleteProcs = (Fl_Text_Predelete_Cb *)0x0;
  this->mPredeleteCbArgs = (void **)0x0;
  this->mCursorPosHint = 0;
  this->mCanUndo = '\x01';
  this->input_file_was_transcoded = 0;
  this->transcoding_warning_action = def_transcoding_warning_action;
  return;
}

Assistant:

Fl_Text_Buffer::Fl_Text_Buffer(int requestedSize, int preferredGapSize)
{
  mLength = 0;
  mPreferredGapSize = preferredGapSize;
  mBuf = (char *) malloc(requestedSize + mPreferredGapSize);
  mGapStart = 0;
  mGapEnd = mPreferredGapSize;
  mTabDist = 8;
  mPrimary.mSelected = 0;
  mPrimary.mStart = mPrimary.mEnd = 0;
  mSecondary.mSelected = 0;
  mSecondary.mStart = mSecondary.mEnd = 0;
  mHighlight.mSelected = 0;
  mHighlight.mStart = mHighlight.mEnd = 0;
  mModifyProcs = NULL;
  mCbArgs = NULL;
  mNModifyProcs = 0;
  mNPredeleteProcs = 0;
  mPredeleteProcs = NULL;
  mPredeleteCbArgs = NULL;
  mCursorPosHint = 0;
  mCanUndo = 1;
  input_file_was_transcoded = 0;
  transcoding_warning_action = def_transcoding_warning_action;
}